

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

_Bool GPU_SaveImage_RW(GPU_Image *image,SDL_RWops *rwops,_Bool free_rwops,GPU_FileFormatEnum format)

{
  SDL_Surface *surface_00;
  SDL_Surface *surface;
  _Bool result;
  GPU_FileFormatEnum format_local;
  _Bool free_rwops_local;
  SDL_RWops *rwops_local;
  GPU_Image *image_local;
  
  if ((_gpu_current_renderer == (GPU_Renderer *)0x0) ||
     (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0)) {
    image_local._7_1_ = false;
  }
  else {
    surface_00 = GPU_CopySurfaceFromImage(image);
    image_local._7_1_ = GPU_SaveSurface_RW(surface_00,rwops,free_rwops,format);
    SDL_FreeSurface(surface_00);
  }
  return image_local._7_1_;
}

Assistant:

GPU_bool GPU_SaveImage_RW(GPU_Image* image, SDL_RWops* rwops, GPU_bool free_rwops, GPU_FileFormatEnum format)
{
    GPU_bool result;
    if(_gpu_current_renderer == NULL || _gpu_current_renderer->current_context_target == NULL)
        return GPU_FALSE;

    SDL_Surface* surface = GPU_CopySurfaceFromImage(image);
    result = GPU_SaveSurface_RW(surface, rwops, free_rwops, format);
    SDL_FreeSurface(surface);
    return result;
}